

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_mset(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  CHAR_DATA *ch_00;
  CClass *pCVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  tribe_type *ptVar11;
  CProficiencies *pCVar12;
  char arg2 [4608];
  char arg3 [4608];
  char buf [300];
  char arg1 [4608];
  char local_4838 [4608];
  char local_3638 [4608];
  AFFECT_DATA local_2438 [44];
  char local_1238 [4616];
  
  smash_tilde(argument);
  pcVar6 = one_argument(argument,local_1238);
  pcVar6 = one_argument(pcVar6,local_4838);
  strcpy(local_3638,pcVar6);
  if (((local_1238[0] == '\0') || (local_4838[0] == '\0')) || (local_3638[0] == '\0')) {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  set char <name> <field> <value>\n\r",ch);
    send_to_char("  Field being one of:\n\r",ch);
    send_to_char("    str int wis dex con sex class level\n\r",ch);
    send_to_char("    race group gold hp mana move prac\n\r",ch);
    send_to_char("    align train thirst hunger drunk home\n\r",ch);
    send_to_char("    xptotal size dam_mod tribe special pause\n\r",ch);
    pcVar6 = "    beauty security aggressor proficiency profpoints\n\r";
    goto LAB_00273e85;
  }
  ch_00 = get_char_world(ch,local_1238);
  if (ch_00 == (CHAR_DATA *)0x0) {
    pcVar6 = "They aren\'t here.\n\r";
    goto LAB_00273e85;
  }
  ch_00->zone = (AREA_DATA_conflict *)0x0;
  bVar2 = is_number(local_3638);
  uVar4 = 0xffffffff;
  if (bVar2) {
    uVar4 = atoi(local_3638);
  }
  bVar2 = str_cmp(local_4838,"aggressor");
  if (!bVar2) {
    init_affect(local_2438);
    local_2438[0].where = 0;
    local_2438[0].type = gsn_aggressor;
    local_2438[0].aftype = 5;
    local_2438[0].level = 0x3c;
    local_2438[0].duration = 0xc;
    affect_to_char(ch_00,local_2438);
    pcVar6 = "Aggressor status set.\n\r";
    goto LAB_00273e85;
  }
  bVar2 = str_cmp(local_4838,"beauty");
  sVar3 = (short)uVar4;
  if (!bVar2) {
    if (uVar4 - 1 < 10) {
      ch_00->pcdata->beauty = sVar3;
      return;
    }
    pcVar6 = "Invalid beauty modifier.\n\r";
    goto LAB_00273e85;
  }
  bVar2 = str_cmp(local_4838,"size");
  if (!bVar2) {
    if (uVar4 < 7) {
      ch_00->size = sVar3;
      return;
    }
    pcVar6 = "Invalid size value.\n\r";
    goto LAB_00273e85;
  }
  bVar2 = str_cmp(local_4838,"xptotal");
  if (!bVar2) {
    if (-1 < (int)uVar4) {
      ch_00->exp = uVar4;
      return;
    }
    pcVar6 = "Xp total must be greater than 0.\n\r";
    goto LAB_00273e85;
  }
  bVar2 = str_cmp(local_4838,"home");
  if (!bVar2) {
    iVar5 = hometown_lookup(local_3638);
    if (iVar5 != 0) {
      iVar5 = hometown_lookup(local_3638);
      ch_00->hometown = iVar5;
      return;
    }
    pcVar6 = "No such hometown.\n\r";
    goto LAB_00273e85;
  }
  bVar2 = str_cmp(local_4838,"sp");
  if (!bVar2) {
    if (uVar4 < 0x4e21) {
      ch_00->pcdata->sp = sVar3;
      return;
    }
    pcVar6 = "Specialization points are between 0 and 20000.\n\r";
    goto LAB_00273e85;
  }
  bVar2 = str_cmp(local_4838,"str");
  if (!bVar2) {
    if ((2 < (int)uVar4) && (iVar5 = get_max_train(ch_00,0), (int)uVar4 <= iVar5)) {
      ch_00->perm_stat[0] = sVar3;
      return;
    }
    uVar4 = get_max_train(ch_00,0);
    pcVar6 = "Strength range is 3 to %d\n\r.";
    goto LAB_00273f6a;
  }
  bVar2 = str_cmp(local_4838,"security");
  if (!bVar2) {
    bVar2 = is_npc(ch_00);
    if (!bVar2) {
      if (uVar4 < 0xb) {
        ch_00->pcdata->security = uVar4;
        return;
      }
      pcVar6 = "Valid security is 0-10 only.\n\r";
      goto LAB_00273e85;
    }
    goto LAB_00273fa6;
  }
  bVar2 = str_cmp(local_4838,"int");
  if (bVar2) {
    bVar2 = str_cmp(local_4838,"wis");
    if (!bVar2) {
      if ((2 < (int)uVar4) && (iVar5 = get_max_train(ch_00,2), (int)uVar4 <= iVar5)) {
        ch_00->perm_stat[2] = sVar3;
        return;
      }
      uVar4 = get_max_train(ch_00,2);
      pcVar6 = "Wisdom range is 3 to %d.\n\r";
      goto LAB_00273f6a;
    }
    bVar2 = str_cmp(local_4838,"dex");
    if (!bVar2) {
      if ((2 < (int)uVar4) && (iVar5 = get_max_train(ch_00,3), (int)uVar4 <= iVar5)) {
        ch_00->perm_stat[3] = sVar3;
        return;
      }
      uVar4 = get_max_train(ch_00,3);
      pcVar6 = "Dexterity ranges is 3 to %d.\n\r";
      goto LAB_00273f6a;
    }
    bVar2 = str_cmp(local_4838,"con");
    if (!bVar2) {
      if ((2 < (int)uVar4) && (iVar5 = get_max_train(ch_00,4), (int)uVar4 <= iVar5)) {
        ch_00->perm_stat[4] = sVar3;
        return;
      }
      uVar4 = get_max_train(ch_00,4);
      pcVar6 = "Constitution range is 3 to %d.\n\r";
      goto LAB_00273f6a;
    }
    bVar2 = str_prefix(local_4838,"sex");
    if (!bVar2) {
      if (uVar4 < 3) {
        ch_00->sex = sVar3;
        bVar2 = is_npc(ch_00);
        if (bVar2) {
          return;
        }
        ch_00->pcdata->true_sex = sVar3;
        return;
      }
      pcVar6 = "Sex range is 0 to 2.\n\r";
      goto LAB_00273e85;
    }
    bVar2 = str_prefix(local_4838,"class");
    if (bVar2) {
      bVar2 = str_prefix(local_4838,"level");
      if (!bVar2) {
        bVar2 = is_npc(ch_00);
        if (bVar2) {
          if (uVar4 < 0x3d) {
            ch_00->level = sVar3;
            return;
          }
          pcVar6 = "Level range is 0 to 60.\n\r";
        }
        else {
          pcVar6 = "Not on PC\'s.\n\r";
        }
        goto LAB_00273e85;
      }
      bVar2 = str_prefix(local_4838,"gold");
      if (!bVar2) {
        ch_00->gold = (long)(int)uVar4;
        return;
      }
      bVar2 = str_prefix(local_4838,"hp");
      if (!bVar2) {
        if (0xffff8ac4 < uVar4 - 0x7531) {
          ch_00->max_hit = sVar3;
          bVar2 = is_npc(ch_00);
          if (bVar2) {
            return;
          }
          ch_00->pcdata->perm_hit = sVar3;
          return;
        }
        pcVar6 = "Hp range is -10 to 30,000 hit points.\n\r";
        goto LAB_00273e85;
      }
      bVar2 = str_prefix(local_4838,"mana");
      if (!bVar2) {
        if (uVar4 < 0x7531) {
          ch_00->max_mana = sVar3;
          bVar2 = is_npc(ch_00);
          if (bVar2) {
            return;
          }
          ch_00->pcdata->perm_mana = sVar3;
          return;
        }
        pcVar6 = "mana range is 0 to 30,000 mana points.\n\r";
        goto LAB_00273e85;
      }
      bVar2 = str_prefix(local_4838,"move");
      if (!bVar2) {
        if (uVar4 < 0x7531) {
          ch_00->max_move = sVar3;
          bVar2 = is_npc(ch_00);
          if (bVar2) {
            return;
          }
          ch_00->pcdata->perm_move = sVar3;
          return;
        }
        pcVar6 = "Move range is 0 to 30,000 move points.\n\r";
        goto LAB_00273e85;
      }
      bVar2 = str_prefix(local_4838,"practice");
      if (!bVar2) {
        if (uVar4 < 0xfb) {
          ch_00->practice = sVar3;
          return;
        }
        pcVar6 = "Practice range is 0 to 250 sessions.\n\r";
        goto LAB_00273e85;
      }
      bVar2 = str_prefix(local_4838,"train");
      if (!bVar2) {
        if (uVar4 < 0x33) {
          ch_00->train = sVar3;
          return;
        }
        pcVar6 = "Training session range is 0 to 50 sessions.\n\r";
        goto LAB_00273e85;
      }
      bVar2 = str_prefix(local_4838,"align");
      if (!bVar2) {
        if (0xfffff82e < uVar4 - 0x3e9) {
          ch_00->alignment = sVar3;
          return;
        }
        pcVar6 = "Alignment range is -1000 to 1000.\n\r";
        goto LAB_00273e85;
      }
      bVar2 = str_prefix(local_4838,"ethos");
      if (!bVar2) {
        if (0xfffff82e < uVar4 - 0x3e9) {
          bVar2 = is_npc(ch_00);
          if (bVar2) {
            return;
          }
          ch_00->pcdata->ethos = sVar3;
          return;
        }
        pcVar6 = "Ethos range is -1000 to 1000.\n\r";
        goto LAB_00273e85;
      }
      bVar2 = str_prefix(local_4838,"thirst");
      if (bVar2) {
        bVar2 = str_prefix(local_4838,"drunk");
        if (bVar2) {
          bVar2 = str_prefix(local_4838,"hunger");
          if (bVar2) {
            bVar2 = str_prefix(local_4838,"race");
            if (!bVar2) {
              iVar5 = race_lookup(local_3638);
              if (iVar5 == 0) {
                pcVar6 = "That is not a valid race.\n\r";
              }
              else {
                bVar2 = is_npc(ch_00);
                if ((bVar2) ||
                   (race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar5].pc_race != false)) {
                  ch_00->race = (short)iVar5;
                  ch_00->size = pc_race_table[iVar5].size;
                  return;
                }
                pcVar6 = "That is not a valid player race.\n\r";
              }
              goto LAB_00273e85;
            }
            bVar2 = str_prefix(local_4838,"group");
            if (!bVar2) {
              bVar2 = is_npc(ch_00);
              if (bVar2) {
                ch_00->group = sVar3;
                return;
              }
              pcVar6 = "Only on NPCs.\n\r";
              goto LAB_00273e85;
            }
            bVar2 = str_prefix(local_4838,"dam_mod");
            if (!bVar2) {
              bVar2 = is_number(local_3638);
              if (!bVar2) {
                pcVar6 = "Invalid dam_mod.\n\r";
                goto LAB_00273e85;
              }
              iVar5 = atoi(local_3638);
              ch_00->dam_mod = (float)iVar5;
              bVar2 = is_npc(ch_00);
              sprintf((char *)local_2438,"%s\'s dam_mod set to %f%%.\n\r",
                      SUB84((double)ch_00->dam_mod,0),(&ch_00->name)[(ulong)bVar2 * 4]);
              goto LAB_00273f7e;
            }
            bVar2 = str_prefix(local_4838,"tribe");
            if ((!bVar2) && (iVar5 = get_trust(ch), 0x3a < iVar5)) {
              ptVar11 = tribe_table;
              bVar2 = str_prefix(local_3638,"none");
              if (bVar2) {
                ptVar11 = tribe_table;
                sVar1 = 1;
                do {
                  sVar3 = sVar1;
                  ptVar11 = ptVar11 + 1;
                  if (ptVar11->name == (char *)0x0) break;
                  bVar2 = str_prefix(local_3638,ptVar11->name);
                  sVar1 = sVar3 + 1;
                } while (bVar2);
              }
              else {
                sVar3 = 0;
              }
              pcVar6 = ptVar11->name;
              if (pcVar6 == (char *)0x0) {
                pcVar6 = "There is no tribe by that name.\n\r";
              }
              else {
                ch_00->pcdata->tribe = sVar3;
                pcVar10 = ch_00->name;
                pcVar9 = capitalize(pcVar6);
                pcVar6 = (char *)local_2438;
                sprintf(pcVar6,"%s is now in the %s tribe.\n\r",pcVar10,pcVar9);
              }
              goto LAB_00273e85;
            }
            bVar2 = str_prefix(local_4838,"specializations");
            if (bVar2) {
              bVar2 = str_prefix(local_4838,"pause");
              if (bVar2) {
                bVar2 = str_prefix(local_4838,"proficiency");
                if (!bVar2) {
                  pcVar10 = one_argument(pcVar6,(char *)local_2438);
                  sVar3 = CProficiencies::ProfIndexLookup((char *)local_2438);
                  bVar2 = is_npc(ch_00);
                  if (bVar2) {
                    pcVar6 = "Not on mobiles.\n\r";
                  }
                  else {
                    pcVar6 = "Invalid input.\n\r";
                    if (((-1 < sVar3) && (bVar2 = is_number(pcVar10), bVar2)) &&
                       (iVar5 = atoi(pcVar10), 0xfffffff3 < iVar5 - 0xbU)) {
                      if (ch_00->pcdata == (PC_DATA *)0x0) {
                        pCVar12 = &prof_none;
                      }
                      else {
                        pCVar12 = &ch_00->pcdata->profs;
                      }
                      CProficiencies::SetProf(pCVar12,(int)sVar3,iVar5);
                      pcVar6 = "Proficiency set.\n\r";
                    }
                  }
                  goto LAB_00273e85;
                }
                bVar2 = str_prefix(local_4838,"profpoints");
                if (bVar2) {
                  do_mset(ch,"");
                  return;
                }
                bVar2 = is_npc(ch_00);
                if ((!bVar2) && (bVar2 = is_number(local_3638), bVar2)) {
                  pCVar12 = &ch_00->pcdata->profs;
                  if (ch_00->pcdata == (PC_DATA *)0x0) {
                    pCVar12 = &prof_none;
                  }
                  iVar5 = atoi(local_3638);
                  CProficiencies::SetPoints(pCVar12,iVar5);
                  pcVar10 = ch_00->name;
                  pCVar12 = &ch_00->pcdata->profs;
                  if (ch_00->pcdata == (PC_DATA *)0x0) {
                    pCVar12 = &prof_none;
                  }
                  uVar4 = CProficiencies::GetPoints(pCVar12);
                  pcVar6 = (char *)local_2438;
                  sprintf(pcVar6,"%s now has %d proficiency points.\n\r",pcVar10,(ulong)uVar4);
                  goto LAB_00273e85;
                }
              }
              else {
                bVar2 = is_npc(ch_00);
                if (!bVar2) {
                  bVar2 = is_number(local_3638);
                  if (!bVar2) {
                    pcVar6 = "Invalid pause.\n\r";
                    goto LAB_00273e85;
                  }
                  iVar5 = atoi(local_3638);
                  sVar3 = (short)iVar5;
                  ch_00->pause = sVar3;
                  pcVar6 = ch_00->true_name;
                  pcVar10 = "%s\'s pause set to %d.\n\r";
                  goto LAB_002746f9;
                }
              }
            }
            else {
              bVar2 = is_npc(ch_00);
              if ((!bVar2) && (bVar2 = is_number(local_3638), bVar2)) {
                iVar5 = atoi(local_3638);
                sVar3 = (short)iVar5;
                ch_00->pcdata->special = sVar3;
                pcVar6 = ch_00->name;
                pcVar10 = "%s now has %d specializations.\n\r";
LAB_002746f9:
                sprintf((char *)local_2438,pcVar10,pcVar6,(ulong)(uint)(int)sVar3);
                goto LAB_00273f7e;
              }
            }
            pcVar6 = "You can\'t do that.\n\r";
            goto LAB_00273e85;
          }
          bVar2 = is_npc(ch_00);
          if (!bVar2) {
            if (0xffffff99 < uVar4 - 0x65) {
              ch_00->pcdata->condition[3] = sVar3;
              return;
            }
            pcVar6 = "Full range is -1 to 100.\n\r";
            goto LAB_00273e85;
          }
        }
        else {
          bVar2 = is_npc(ch_00);
          if (!bVar2) {
            if (0xffffff99 < uVar4 - 0x65) {
              ch_00->pcdata->condition[0] = sVar3;
              return;
            }
            pcVar6 = "Drunk range is -1 to 100.\n\r";
            goto LAB_00273e85;
          }
        }
      }
      else {
        bVar2 = is_npc(ch_00);
        if (!bVar2) {
          if (0xffffff99 < uVar4 - 0x65) {
            ch_00->pcdata->condition[2] = sVar3;
            return;
          }
          pcVar6 = "Thirst range is -1 to 100.\n\r";
          goto LAB_00273e85;
        }
      }
LAB_00273fa6:
      pcVar6 = "Not on NPC\'s.\n\r";
      goto LAB_00273e85;
    }
    bVar2 = is_npc(ch_00);
    if (bVar2) {
      pcVar6 = "Mobiles have no class.\n\r";
      goto LAB_00273e85;
    }
    iVar5 = CClass::Lookup(local_3638);
    if (iVar5 != -1) {
      pCVar7 = CClass::GetClass(iVar5);
      ch_00->my_class = pCVar7;
      return;
    }
    local_2438[0].next = (AFFECT_DATA *)0x656c626973736f50;
    local_2438[0].owner._0_7_ = 0x657373616c6320;
    local_2438[0].owner._7_1_ = 0x73;
    local_2438[0].name._0_7_ = 0x203a65726120;
    iVar5 = 0;
    do {
      if (iVar5 != 0) {
        sVar8 = strlen((char *)local_2438);
        *(undefined2 *)((long)local_2438[0].bitvector + (sVar8 - 0x28)) = 0x20;
      }
      pCVar7 = CClass::GetClass(iVar5);
      pcVar6 = RString::operator_cast_to_char_(&pCVar7->name);
      strcat((char *)local_2438,pcVar6);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0xc);
    sVar8 = strlen((char *)local_2438);
    *(undefined4 *)((long)local_2438[0].bitvector + (sVar8 - 0x28)) = 0xd0a2e;
  }
  else {
    if ((2 < (int)uVar4) && (iVar5 = get_max_train(ch_00,1), (int)uVar4 <= iVar5)) {
      ch_00->perm_stat[1] = sVar3;
      return;
    }
    uVar4 = get_max_train(ch_00,1);
    pcVar6 = "Intelligence range is 3 to %d.\n\r";
LAB_00273f6a:
    sprintf((char *)local_2438,pcVar6,(ulong)uVar4);
  }
LAB_00273f7e:
  pcVar6 = (char *)local_2438;
LAB_00273e85:
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void do_mset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	char buf[300];
	CHAR_DATA *victim;
	int value, i;
	AFFECT_DATA af;

	smash_tilde(argument);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set char <name> <field> <value>\n\r", ch);
		send_to_char("  Field being one of:\n\r", ch);
		send_to_char("    str int wis dex con sex class level\n\r", ch);
		send_to_char("    race group gold hp mana move prac\n\r", ch);
		send_to_char("    align train thirst hunger drunk home\n\r", ch);
		send_to_char("    xptotal size dam_mod tribe special pause\n\r", ch);
		send_to_char("    beauty security aggressor proficiency profpoints\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	/* clear zones for mobs */
	victim->zone = nullptr;

	/*
	 * Snarf the value (which need not be numeric).
	 */
	value = is_number(arg3) ? atoi(arg3) : -1;

	/*
	 * Set something.
	 */
	if (!str_cmp(arg2, "aggressor"))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_aggressor;
		af.aftype = AFT_INVIS;
		af.level = 60;
		af.duration = 12;
		affect_to_char(victim, &af);

		send_to_char("Aggressor status set.\n\r", ch);
		return;
	}
	else if (!str_cmp(arg2, "beauty"))
	{
		if (value > 0 && value < 11)
		{
			victim->pcdata->beauty = value;
			return;
		}
		else
		{
			send_to_char("Invalid beauty modifier.\n\r", ch);
			return;
		}
	}

	if (!str_cmp(arg2, "size"))
	{
		if (value > -1 && value <= SIZE_IMMENSE)
		{
			victim->size = value;
			return;
		}

		send_to_char("Invalid size value.\n\r", ch);
		return;
	}

	if (!str_cmp(arg2, "xptotal"))
	{
		if (value < 0)
		{
			send_to_char("Xp total must be greater than 0.\n\r", ch);
			return;
		}

		victim->exp = value;
		return;
	}

	if (!str_cmp(arg2, "home"))
	{
		if (hometown_lookup(arg3))
		{
			victim->hometown = hometown_lookup(arg3);
			return;
		}
		else
		{
			send_to_char("No such hometown.\n\r", ch);
			return;
		}
	}

	if (!str_cmp(arg2, "sp"))
	{
		if (value < 0 || value > 20000)
		{
			send_to_char("Specialization points are between 0 and 20000.\n\r", ch);
			return;
		}

		victim->pcdata->sp = value;
		return;
	}

	if (!str_cmp(arg2, "str"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_STR))
		{
			sprintf(buf, "Strength range is 3 to %d\n\r.", get_max_train(victim, STAT_STR));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_STR] = value;
		return;
	}

	if (!str_cmp(arg2, "security")) /* OLC */
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < 0 || value > 10)
		{
			send_to_char("Valid security is 0-10 only.\n\r", ch);
		}
		else
		{
			victim->pcdata->security = value;
		}

		return;
	}

	if (!str_cmp(arg2, "int"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_INT))
		{
			sprintf(buf, "Intelligence range is 3 to %d.\n\r", get_max_train(victim, STAT_INT));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_INT] = value;
		return;
	}

	if (!str_cmp(arg2, "wis"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_WIS))
		{
			sprintf(buf, "Wisdom range is 3 to %d.\n\r", get_max_train(victim, STAT_WIS));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_WIS] = value;
		return;
	}

	if (!str_cmp(arg2, "dex"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_DEX))
		{
			sprintf(buf, "Dexterity ranges is 3 to %d.\n\r", get_max_train(victim, STAT_DEX));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_DEX] = value;
		return;
	}

	if (!str_cmp(arg2, "con"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_CON))
		{
			sprintf(buf, "Constitution range is 3 to %d.\n\r", get_max_train(victim, STAT_CON));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_CON] = value;
		return;
	}

	if (!str_prefix(arg2, "sex"))
	{
		if (value < 0 || value > 2)
		{
			send_to_char("Sex range is 0 to 2.\n\r", ch);
			return;
		}

		victim->sex = value;

		if (!is_npc(victim))
			victim->pcdata->true_sex = value;

		return;
	}

	if (!str_prefix(arg2, "class"))
	{
		if (is_npc(victim))
		{
			send_to_char("Mobiles have no class.\n\r", ch);
			return;
		}

		int sclass = CClass::Lookup(arg3);
		if (sclass == -1)
		{
			char buf[MAX_STRING_LENGTH];

			strcpy(buf, "Possible classes are: ");
			for (sclass = 0; sclass < MAX_CLASS; sclass++)
			{
				if (sclass > 0)
					strcat(buf, " ");

				strcat(buf, CClass::GetClass(sclass)->name);
			}

			strcat(buf, ".\n\r");

			send_to_char(buf, ch);
			return;
		}

		victim->SetClass(sclass);
		return;
	}

	if (!str_prefix(arg2, "level"))
	{
		if (!is_npc(victim))
		{
			send_to_char("Not on PC's.\n\r", ch);
			return;
		}

		if (value < 0 || value > 60)
		{
			send_to_char("Level range is 0 to 60.\n\r", ch);
			return;
		}

		victim->level = value;
		return;
	}

	if (!str_prefix(arg2, "gold"))
	{
		victim->gold = value;
		return;
	}

	if (!str_prefix(arg2, "hp"))
	{
		if (value < -10 || value > 30000)
		{
			send_to_char("Hp range is -10 to 30,000 hit points.\n\r", ch);
			return;
		}

		victim->max_hit = value;

		if (!is_npc(victim))
			victim->pcdata->perm_hit = value;

		return;
	}

	if (!str_prefix(arg2, "mana"))
	{
		if (value < 0 || value > 30000)
		{
			send_to_char("mana range is 0 to 30,000 mana points.\n\r", ch);
			return;
		}

		victim->max_mana = value;

		if (!is_npc(victim))
			victim->pcdata->perm_mana = value;

		return;
	}

	if (!str_prefix(arg2, "move"))
	{
		if (value < 0 || value > 30000)
		{
			send_to_char("Move range is 0 to 30,000 move points.\n\r", ch);
			return;
		}

		victim->max_move = value;

		if (!is_npc(victim))
			victim->pcdata->perm_move = value;

		return;
	}

	if (!str_prefix(arg2, "practice"))
	{
		if (value < 0 || value > 250)
		{
			send_to_char("Practice range is 0 to 250 sessions.\n\r", ch);
			return;
		}

		victim->practice = value;
		return;
	}

	if (!str_prefix(arg2, "train"))
	{
		if (value < 0 || value > 50)
		{
			send_to_char("Training session range is 0 to 50 sessions.\n\r", ch);
			return;
		}

		victim->train = value;
		return;
	}

	if (!str_prefix(arg2, "align"))
	{
		if (value < -1000 || value > 1000)
		{
			send_to_char("Alignment range is -1000 to 1000.\n\r", ch);
			return;
		}

		victim->alignment = value;
		return;
	}

	if (!str_prefix(arg2, "ethos"))
	{
		if (value < -1000 || value > 1000)
		{
			send_to_char("Ethos range is -1000 to 1000.\n\r", ch);
			return;
		}

		if (!is_npc(victim))
			victim->pcdata->ethos = value;

		return;
	}

	if (!str_prefix(arg2, "thirst"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Thirst range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_THIRST] = value;
		return;
	}

	if (!str_prefix(arg2, "drunk"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Drunk range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_DRUNK] = value;
		return;
	}

	if (!str_prefix(arg2, "hunger"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Full range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_HUNGER] = value;
		return;
	}

	if (!str_prefix(arg2, "race"))
	{
		int race = race_lookup(arg3);

		if (race == 0)
		{
			send_to_char("That is not a valid race.\n\r", ch);
			return;
		}

		if (!is_npc(victim) && !race_table[race].pc_race)
		{
			send_to_char("That is not a valid player race.\n\r", ch);
			return;
		}

		victim->race = race;
		victim->size = pc_race_table[race].size;
		return;
	}

	if (!str_prefix(arg2, "group"))
	{
		if (!is_npc(victim))
		{
			send_to_char("Only on NPCs.\n\r", ch);
			return;
		}

		victim->group = value;
		return;
	}

	if (!str_prefix(arg2, "dam_mod"))
	{
		if (!is_number(arg3))
		{
			send_to_char("Invalid dam_mod.\n\r", ch);
			return;
		}

		victim->dam_mod = atoi(arg3);

		sprintf(buf, "%s's dam_mod set to %f%%.\n\r",
			is_npc(victim) ? victim->short_descr : victim->name,
			victim->dam_mod);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "tribe") && get_trust(ch) >= 59)
	{
		for (i = 0; tribe_table[i].name; i++)
		{
			if (!str_prefix(arg3, tribe_table[i].name))
				break;
		}

		if (!tribe_table[i].name)
		{
			send_to_char("There is no tribe by that name.\n\r", ch);
			return;
		}

		victim->pcdata->tribe = i;

		sprintf(buf, "%s is now in the %s tribe.\n\r", victim->name, capitalize(tribe_table[i].name));
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "specializations"))
	{
		if (is_npc(victim) || !is_number(arg3))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		victim->pcdata->special = atoi(arg3);

		sprintf(buf, "%s now has %d specializations.\n\r", victim->name, victim->pcdata->special);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "pause"))
	{
		if (is_npc(victim))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		if (!is_number(arg3))
		{
			send_to_char("Invalid pause.\n\r", ch);
			return;
		}

		victim->pause = atoi(arg3);

		sprintf(buf, "%s's pause set to %d.\n\r", victim->true_name, victim->pause);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "proficiency"))
	{
		char buf4[MSL];

		argument = one_argument(argument, buf4);

		int ind = CProficiencies::ProfIndexLookup(buf4);

		if (is_npc(victim))
		{
			send_to_char("Not on mobiles.\n\r", ch);
			return;
		}

		if (ind < 0 || !is_number(argument) || atoi(argument) > 10 || atoi(argument) < -1)
		{
			send_to_char("Invalid input.\n\r", ch);
			return;
		}

		victim->Profs()->SetProf(ind, atoi(argument));

		send_to_char("Proficiency set.\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "profpoints"))
	{
		if (is_npc(victim) || !is_number(arg3))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		victim->Profs()->SetPoints(atoi(arg3));

		sprintf(buf, "%s now has %d proficiency points.\n\r", victim->name, victim->Profs()->GetPoints());
		send_to_char(buf, ch);
		return;
	}

	/*
	 * Generate usage message.
	 */
	do_mset(ch, "");
}